

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

bool __thiscall
ConvexDecomposition::HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,float *svertices,uint stride,uint *vcount,float *vertices,
          float normalepsilon,float *scale)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  undefined8 uVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  undefined1 (*pauVar10) [16];
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar17;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM5 [64];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  uint local_68;
  uint uStack_64;
  float fStack_60;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_48;
  uint uStack_44;
  float bmax_1 [3];
  uint uStack_34;
  float bmin_1 [3];
  float bmax [3];
  float bmin [3];
  undefined1 auVar28 [16];
  
  auVar27 = in_ZMM5._0_16_;
  if (svcount != 0) {
    *vcount = 0;
    if (scale != (float *)0x0) {
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      uVar1 = vmovlps_avx(auVar31);
      *(undefined8 *)scale = uVar1;
      scale[2] = 1.0;
    }
    bmin_1[0] = 3.4028235e+38;
    bmax_1[0] = -3.4028235e+38;
    bmax_1[2] = 3.4028235e+38;
    uStack_34 = 0x7f7fffff;
    uStack_48 = 0xff7fffff;
    uStack_44 = 0xff7fffff;
    pauVar10 = (undefined1 (*) [16])svertices;
    uVar12 = svcount;
    do {
      auVar31 = *pauVar10;
      auVar18._0_12_ = auVar31._0_12_;
      auVar18._12_4_ = 0;
      auVar19._4_4_ = uStack_34;
      auVar19._0_4_ = bmax_1[2];
      auVar19._8_4_ = bmin_1[0];
      auVar19._12_4_ = 0;
      auVar25._4_4_ = uStack_44;
      auVar25._0_4_ = uStack_48;
      auVar25._8_4_ = bmax_1[0];
      auVar25._12_4_ = 0;
      pauVar10 = (undefined1 (*) [16])(*pauVar10 + stride);
      uVar12 = uVar12 - 1;
      uVar1 = vcmpps_avx512vl(auVar18,auVar19,1);
      bVar5 = (byte)uVar1 & 7;
      bVar2 = (bool)((byte)uVar1 & 1);
      bmax_1[2] = (float)((uint)bVar2 * auVar31._0_4_ | (uint)!bVar2 * (int)bmax_1[2]);
      bVar2 = (bool)(bVar5 >> 1 & 1);
      uStack_34 = (uint)bVar2 * auVar31._4_4_ | !bVar2 * uStack_34;
      bVar2 = (bool)(bVar5 >> 2);
      bmin_1[0] = (float)((uint)bVar2 * auVar31._8_4_ | (uint)!bVar2 * (int)bmin_1[0]);
      uVar1 = vcmpps_avx512vl(auVar25,auVar18,1);
      bVar5 = (byte)uVar1 & 7;
      bVar2 = (bool)((byte)uVar1 & 1);
      uStack_48 = (uint)bVar2 * auVar31._0_4_ | !bVar2 * uStack_48;
      bVar2 = (bool)(bVar5 >> 1 & 1);
      uStack_44 = (uint)bVar2 * auVar31._4_4_ | !bVar2 * uStack_44;
      bVar2 = (bool)(bVar5 >> 2);
      bmax_1[0] = (float)((uint)bVar2 * auVar31._8_4_ | (uint)!bVar2 * (int)bmax_1[0]);
    } while (uVar12 != 0);
    auVar36._4_4_ = uStack_44;
    auVar36._0_4_ = uStack_48;
    auVar36._8_8_ = 0;
    auVar33._4_4_ = uStack_34;
    auVar33._0_4_ = bmax_1[2];
    auVar33._8_8_ = 0;
    auVar31 = vsubps_avx(auVar36,auVar33);
    fVar39 = bmax_1[0] - bmin_1[0];
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)bmin_1[0]),ZEXT416((uint)fVar39),ZEXT416(0x3f000000));
    auVar32._8_4_ = 0x3f000000;
    auVar32._0_8_ = 0x3f0000003f000000;
    auVar32._12_4_ = 0x3f000000;
    auVar20 = vfmadd231ps_avx512vl(auVar33,auVar31,auVar32);
    auVar37._8_4_ = 0x358637bd;
    auVar37._0_8_ = 0x358637bd358637bd;
    auVar37._12_4_ = 0x358637bd;
    uVar14 = vcmpps_avx512vl(auVar31,auVar37,1);
    fVar17 = auVar18._0_4_;
    fVar42 = auVar20._4_4_;
    fVar43 = auVar20._8_4_;
    fVar3 = auVar20._12_4_;
    if ((((svcount < 3) || ((uVar14 & 1) != 0)) || ((uVar14 >> 1 & 1) != 0)) || (fVar39 < 1e-06)) {
      auVar19 = SUB6416(ZEXT464(0x358637bd),0);
      uVar1 = vcmpss_avx512f(auVar19,auVar31,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar27 = vminss_avx(auVar31,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar12 = (uint)bVar2 * auVar27._0_4_ + (uint)!bVar2 * 0x7f7fffff;
      auVar18 = vmovshdup_avx(auVar31);
      auVar27 = vminss_avx(auVar18,ZEXT416(uVar12));
      uVar1 = vcmpss_avx512f(auVar19,auVar18,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      uVar12 = (uint)bVar2 * auVar27._0_4_ + !bVar2 * uVar12;
      uVar1 = vcmpps_avx512vl(auVar19,ZEXT416((uint)fVar39),1);
      uVar4 = vcmpps_avx512vl(ZEXT416((uint)fVar39),ZEXT416(uVar12),1);
      bVar5 = (byte)uVar1 & (byte)uVar4;
      fVar16 = (float)((uint)(bVar5 & 1) * (int)fVar39 + !(bool)(bVar5 & 1) * uVar12);
      if ((fVar16 != 3.4028235e+38) || (NAN(fVar16))) {
        auVar27._8_4_ = 0x358637bd;
        auVar27._0_8_ = 0x358637bd358637bd;
        auVar27._12_4_ = 0x358637bd;
        uVar14 = vcmpps_avx512vl(auVar31,auVar27,1);
        auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar16 * 0.05)));
        bVar2 = (bool)((byte)uVar14 & 1);
        auVar26._0_4_ = (uint)bVar2 * auVar27._0_4_ | (uint)!bVar2 * auVar31._0_4_;
        bVar2 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar26._4_4_ = (uint)bVar2 * auVar27._4_4_ | (uint)!bVar2 * auVar31._4_4_;
        bVar2 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar26._8_4_ = (uint)bVar2 * auVar27._8_4_ | (uint)!bVar2 * auVar31._8_4_;
        bVar2 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar26._12_4_ = (uint)bVar2 * auVar27._12_4_ | (uint)!bVar2 * auVar31._12_4_;
        fVar16 = fVar16 * 0.05;
        if (1e-06 <= fVar39) {
          fVar16 = fVar39;
        }
      }
      else {
        auVar26._8_4_ = 0x3c23d70a;
        auVar26._0_8_ = 0x3c23d70a3c23d70a;
        auVar26._12_4_ = 0x3c23d70a;
        fVar16 = 0.01;
      }
      auVar18 = vsubps_avx(auVar20,auVar26);
      auVar34._0_4_ = auVar20._0_4_ + auVar26._0_4_;
      auVar34._4_4_ = fVar42 + auVar26._4_4_;
      auVar34._8_4_ = fVar43 + auVar26._8_4_;
      auVar34._12_4_ = fVar3 + auVar26._12_4_;
      fVar39 = fVar17 - fVar16;
      fVar17 = fVar17 + fVar16;
      auVar27 = vmovshdup_avx(auVar18);
      auVar31 = vmovshdup_avx(auVar34);
      uVar1 = vmovlps_avx(auVar18);
      *(undefined8 *)vertices = uVar1;
      vertices[2] = fVar39;
      vertices[4] = auVar27._0_4_;
      vertices[5] = fVar39;
      vertices[3] = auVar34._0_4_;
      uVar1 = vmovlps_avx(auVar34);
      *(undefined8 *)(vertices + 6) = uVar1;
      vertices[8] = fVar39;
      vertices[9] = auVar18._0_4_;
      vertices[10] = auVar31._0_4_;
      vertices[0xb] = fVar39;
      uVar1 = vmovlps_avx(auVar18);
      *(undefined8 *)(vertices + 0xc) = uVar1;
      vertices[0xe] = fVar17;
      vertices[0xf] = auVar34._0_4_;
      vertices[0x10] = auVar27._0_4_;
      vertices[0x11] = fVar17;
      uVar1 = vmovlps_avx(auVar34);
      *(undefined8 *)(vertices + 0x12) = uVar1;
      vertices[0x14] = fVar17;
      vertices[0x15] = auVar18._0_4_;
      vertices[0x16] = auVar31._0_4_;
      vertices[0x17] = fVar17;
    }
    else {
      if (scale == (float *)0x0) {
        auVar31 = vmovshdup_avx(auVar20);
        fVar3 = auVar31._0_4_;
      }
      else {
        auVar38._8_4_ = 0x3f800000;
        auVar38._0_8_ = 0x3f8000003f800000;
        auVar38._12_4_ = 0x3f800000;
        uVar1 = vmovlps_avx(auVar31);
        *(undefined8 *)scale = uVar1;
        scale[2] = fVar39;
        auVar27 = vdivps_avx(auVar38,auVar31);
        fVar39 = 1.0 / fVar39;
        auVar20._0_4_ = auVar20._0_4_ * auVar27._0_4_;
        auVar20._4_4_ = fVar42 * auVar27._4_4_;
        auVar20._8_4_ = fVar43 * auVar27._8_4_;
        auVar20._12_4_ = fVar3 * auVar27._12_4_;
        auVar31 = vmovshdup_avx(auVar20);
        fVar3 = auVar31._0_4_;
        auVar18 = ZEXT416((uint)(fVar17 * fVar39));
      }
      auVar41._8_4_ = 0x7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar41._12_4_ = 0x7fffffff;
      auVar40._8_4_ = 0x7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar40._12_4_ = 0x7fffffff;
      uVar12 = -(uint)(scale == (float *)0x0);
      uVar9 = 0;
      uVar13 = 0;
      do {
        uVar11 = 0;
        fVar42 = (float)*(undefined8 *)svertices;
        fVar43 = (float)((ulong)*(undefined8 *)svertices >> 0x20);
        fVar17 = (float)((uint)(scale == (float *)0x0) * (int)svertices[2] +
                        (uint)(scale != (float *)0x0) * (int)(svertices[2] * fVar39));
        bVar2 = (bool)((byte)uVar12 & 1);
        auVar21._0_4_ =
             (float)((uint)bVar2 * (int)fVar42 | (uint)!bVar2 * (int)(fVar42 * auVar27._0_4_));
        bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar21._4_4_ = (uint)bVar2 * (int)fVar43 | (uint)!bVar2 * (int)(fVar43 * auVar27._4_4_);
        auVar21._8_4_ = (uint)!(bool)((byte)(uVar12 >> 2) & 1) * (int)(auVar27._8_4_ * 0.0);
        auVar21._12_4_ = (uint)!(bool)((byte)(uVar12 >> 3) & 1) * (int)(auVar27._12_4_ * 0.0);
        if (uVar13 == 0) {
LAB_00908bba:
          if (uVar11 == uVar13) goto LAB_00908bbf;
        }
        else {
          auVar31 = vmovshdup_avx(auVar21);
          uVar14 = 0;
          uVar11 = 0;
          do {
            uVar15 = uVar14 & 0xffffffff;
            auVar19 = vandps_avx(ZEXT416((uint)(vertices[uVar15] - auVar21._0_4_)),auVar40);
            if (auVar19._0_4_ < normalepsilon) {
              auVar19 = vandps_avx(ZEXT416((uint)(vertices[uVar15 + 1] - auVar31._0_4_)),auVar41);
              if (auVar19._0_4_ < normalepsilon) {
                auVar19 = vandps_avx(ZEXT416((uint)(vertices[uVar15 + 2] - fVar17)),auVar41);
                if (auVar19._0_4_ < normalepsilon) {
                  fVar42 = auVar31._0_4_ - fVar3;
                  fVar43 = vertices[uVar15 + 1] - fVar3;
                  auVar25 = vsubss_avx512f(ZEXT416((uint)fVar17),auVar18);
                  auVar31 = ZEXT416((uint)(auVar21._0_4_ - auVar20._0_4_));
                  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar42 * fVar42)),auVar31,auVar31);
                  auVar19 = ZEXT416((uint)(vertices[uVar15] - auVar20._0_4_));
                  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar43 * fVar43)),auVar19,auVar19);
                  auVar25 = vfmadd231ss_avx512f(auVar31,auVar25,auVar25);
                  auVar31 = ZEXT416((uint)(vertices[uVar15 + 2] - auVar18._0_4_));
                  auVar31 = vfmadd231ss_fma(auVar19,auVar31,auVar31);
                  if (auVar31._0_4_ < auVar25._0_4_) {
                    uVar1 = vmovlps_avx(auVar21);
                    *(undefined8 *)(vertices + uVar15) = uVar1;
                    vertices[uVar15 + 2] = fVar17;
                  }
                  goto LAB_00908bba;
                }
              }
            }
            uVar11 = uVar11 + 1;
            uVar14 = uVar14 + 3;
          } while ((ulong)uVar13 * 3 != uVar14);
LAB_00908bbf:
          uVar11 = uVar13 * 3;
          uVar13 = uVar13 + 1;
          uVar1 = vmovlps_avx(auVar21);
          *(undefined8 *)(vertices + uVar11) = uVar1;
          vertices[(ulong)uVar11 + 2] = fVar17;
          *vcount = uVar13;
        }
        svertices = (float *)((long)svertices + (ulong)stride);
        uVar9 = uVar9 + 1;
      } while (uVar9 != svcount);
      local_58 = 0x7f7fffff;
      uStack_54 = 0x7f7fffff;
      uStack_50 = 0x7f7fffff;
      local_68 = 0xff7fffff;
      uStack_64 = 0xff7fffff;
      fStack_60 = -3.4028235e+38;
      if (uVar13 == 0) {
        auVar29._8_4_ = 0x7f7fffff;
        auVar29._0_8_ = 0x7f7fffff7f7fffff;
        auVar29._12_4_ = 0x7f7fffff;
        auVar35._8_4_ = 0xff7fffff;
        auVar35._0_8_ = 0xff7fffffff7fffff;
        auVar35._12_4_ = 0xff7fffff;
        fStack_60 = -3.4028235e+38;
        auVar27 = SUB6416(ZEXT464(0x7f7fffff),0);
      }
      else {
        uVar14 = 0;
        do {
          auVar27 = *(undefined1 (*) [16])(vertices + (uVar14 & 0xffffffff));
          auVar22._0_12_ = auVar27._0_12_;
          auVar22._12_4_ = 0;
          auVar23._4_4_ = uStack_54;
          auVar23._0_4_ = local_58;
          auVar23._8_4_ = uStack_50;
          auVar23._12_4_ = 0;
          auVar24._4_4_ = uStack_64;
          auVar24._0_4_ = local_68;
          auVar24._8_4_ = fStack_60;
          auVar24._12_4_ = 0;
          uVar14 = uVar14 + 3;
          uVar1 = vcmpps_avx512vl(auVar22,auVar23,1);
          bVar5 = (byte)uVar1;
          local_58 = (uint)(bVar5 & 1) * auVar27._0_4_ | !(bool)(bVar5 & 1) * local_58;
          bVar2 = (bool)((bVar5 & 2) >> 1);
          uStack_54 = (uint)bVar2 * auVar27._4_4_ | !bVar2 * uStack_54;
          bVar2 = (bool)((bVar5 & 4) >> 2);
          uStack_50 = (uint)bVar2 * auVar27._8_4_ | !bVar2 * uStack_50;
          uVar1 = vcmpps_avx512vl(auVar24,auVar22,1);
          bVar5 = (byte)uVar1;
          local_68 = (uint)(bVar5 & 1) * auVar27._0_4_ | !(bool)(bVar5 & 1) * local_68;
          bVar2 = (bool)((bVar5 & 2) >> 1);
          uStack_64 = (uint)bVar2 * auVar27._4_4_ | !bVar2 * uStack_64;
          bVar2 = (bool)((bVar5 & 4) >> 2);
          fStack_60 = (float)((uint)bVar2 * auVar27._8_4_ | (uint)!bVar2 * (int)fStack_60);
        } while ((ulong)uVar13 * 3 != uVar14);
        auVar35._4_4_ = uStack_64;
        auVar35._0_4_ = local_68;
        auVar35._8_8_ = 0;
        auVar29._4_4_ = uStack_54;
        auVar29._0_4_ = local_58;
        auVar29._8_8_ = 0;
        auVar27 = ZEXT416(uStack_50);
      }
      auVar31 = vsubps_avx(auVar35,auVar29);
      auVar6._8_4_ = 0x358637bd;
      auVar6._0_8_ = 0x358637bd358637bd;
      auVar6._12_4_ = 0x358637bd;
      uVar14 = vcmpps_avx512vl(auVar31,auVar6,1);
      fStack_60 = fStack_60 - auVar27._0_4_;
      if (((2 < uVar13) && ((uVar14 & 1) == 0)) &&
         (((uVar14 >> 1 & 1) == 0 && (1e-06 <= fStack_60)))) goto LAB_00908eef;
      auVar7._8_4_ = 0x3f000000;
      auVar7._0_8_ = 0x3f0000003f000000;
      auVar7._12_4_ = 0x3f000000;
      auVar25 = vfmadd231ps_avx512vl(auVar29,auVar31,auVar7);
      auVar32 = SUB6416(ZEXT464(0x358637bd),0);
      uVar1 = vcmpss_avx512f(auVar32,auVar31,2);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar37 = ZEXT416((uint)fStack_60);
      auVar19 = vfmadd231ss_fma(auVar27,auVar37,ZEXT416(0x3f000000));
      auVar27 = vminss_avx(auVar31,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar12 = (uint)bVar2 * auVar27._0_4_ + (uint)!bVar2 * 0x7f7fffff;
      auVar18 = vmovshdup_avx(auVar31);
      auVar27 = vminss_avx(auVar18,ZEXT416(uVar12));
      uVar1 = vcmpss_avx512f(auVar32,auVar18,2);
      bVar2 = (bool)((byte)uVar1 & 1);
      uVar12 = (uint)bVar2 * auVar27._0_4_ + !bVar2 * uVar12;
      uVar1 = vcmpps_avx512vl(auVar32,auVar37,2);
      uVar4 = vcmpps_avx512vl(auVar37,ZEXT416(uVar12),1);
      bVar5 = (byte)uVar1 & (byte)uVar4;
      fVar17 = (float)((uint)(bVar5 & 1) * (int)fStack_60 + !(bool)(bVar5 & 1) * uVar12);
      if ((fVar17 != 3.4028235e+38) || (NAN(fVar17))) {
        auVar8._8_4_ = 0x358637bd;
        auVar8._0_8_ = 0x358637bd358637bd;
        auVar8._12_4_ = 0x358637bd;
        uVar14 = vcmpps_avx512vl(auVar31,auVar8,1);
        auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar17 * 0.05)));
        bVar2 = (bool)((byte)uVar14 & 1);
        auVar28._0_4_ = (uint)bVar2 * auVar27._0_4_ | (uint)!bVar2 * auVar31._0_4_;
        bVar2 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar28._4_4_ = (uint)bVar2 * auVar27._4_4_ | (uint)!bVar2 * auVar31._4_4_;
        bVar2 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar28._8_4_ = (uint)bVar2 * auVar27._8_4_ | (uint)!bVar2 * auVar31._8_4_;
        bVar2 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar28._12_4_ = (uint)bVar2 * auVar27._12_4_ | (uint)!bVar2 * auVar31._12_4_;
        fVar17 = fVar17 * 0.05;
        if (1e-06 <= fStack_60) {
          fVar17 = fStack_60;
        }
      }
      else {
        auVar28._8_4_ = 0x3c23d70a;
        auVar28._0_8_ = 0x3c23d70a3c23d70a;
        auVar28._12_4_ = 0x3c23d70a;
        fVar17 = 0.01;
      }
      auVar18 = vsubps_avx(auVar25,auVar28);
      auVar30._0_4_ = auVar25._0_4_ + auVar28._0_4_;
      auVar30._4_4_ = auVar25._4_4_ + auVar28._4_4_;
      auVar30._8_4_ = auVar25._8_4_ + auVar28._8_4_;
      auVar30._12_4_ = auVar25._12_4_ + auVar28._12_4_;
      fVar39 = auVar19._0_4_ - fVar17;
      fVar17 = auVar19._0_4_ + fVar17;
      auVar27 = vmovshdup_avx(auVar18);
      auVar31 = vmovshdup_avx(auVar30);
      uVar1 = vmovlps_avx(auVar18);
      *(undefined8 *)vertices = uVar1;
      vertices[2] = fVar39;
      vertices[4] = auVar27._0_4_;
      vertices[5] = fVar39;
      vertices[3] = auVar30._0_4_;
      uVar1 = vmovlps_avx(auVar30);
      *(undefined8 *)(vertices + 6) = uVar1;
      vertices[8] = fVar39;
      vertices[9] = auVar18._0_4_;
      vertices[10] = auVar31._0_4_;
      vertices[0xb] = fVar39;
      uVar1 = vmovlps_avx(auVar18);
      *(undefined8 *)(vertices + 0xc) = uVar1;
      vertices[0xe] = fVar17;
      vertices[0xf] = auVar30._0_4_;
      vertices[0x10] = auVar27._0_4_;
      vertices[0x11] = fVar17;
      uVar1 = vmovlps_avx(auVar30);
      *(undefined8 *)(vertices + 0x12) = uVar1;
      vertices[0x14] = fVar17;
      vertices[0x15] = auVar18._0_4_;
      vertices[0x16] = auVar31._0_4_;
      vertices[0x17] = fVar17;
    }
    *vcount = 8;
  }
LAB_00908eef:
  return svcount != 0;
}

Assistant:

bool  HullLibrary::CleanupVertices(unsigned int svcount,
																const float *svertices,
																unsigned int stride,
																unsigned int &vcount,       // output number of vertices
																float *vertices,                 // location to store the results.
																float  normalepsilon,
																float *scale)
{
	if ( svcount == 0 ) return false;


#define EPSILON 0.000001f /* close enough to consider two floating point numbers to be 'the same'. */

	vcount = 0;

	float recip[3];

	if ( scale )
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	float bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
	float bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

	const char *vtx = (const char *) svertices;

	if ( 1 )
	{
		for (unsigned int i=0; i<svcount; i++)
		{
			const float *p = (const float *) vtx;

			vtx+=stride;

			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}
	}

	float dx = bmax[0] - bmin[0];
	float dy = bmax[1] - bmin[1];
	float dz = bmax[2] - bmin[2];

	float center[3];

	center[0] = dx*0.5f + bmin[0];
	center[1] = dy*0.5f + bmin[1];
	center[2] = dz*0.5f + bmin[2];

	if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3 )
	{

		float len = FLT_MAX;

		if ( dx > EPSILON && dx < len ) len = dx;
		if ( dy > EPSILON && dy < len ) len = dy;
		if ( dz > EPSILON && dz < len ) len = dz;

		if ( len == FLT_MAX )
		{
			dx = dy = dz = 0.01f; // one centimeter
		}
		else
		{
			if ( dx < EPSILON ) dx = len * 0.05f; // 1/5th the shortest non-zero edge.
			if ( dy < EPSILON ) dy = len * 0.05f;
			if ( dz < EPSILON ) dz = len * 0.05f;
		}

		float x1 = center[0] - dx;
		float x2 = center[0] + dx;

		float y1 = center[1] - dy;
		float y2 = center[1] + dy;

		float z1 = center[2] - dz;
		float z2 = center[2] + dz;

		addPoint(vcount,vertices,x1,y1,z1);
		addPoint(vcount,vertices,x2,y1,z1);
		addPoint(vcount,vertices,x2,y2,z1);
		addPoint(vcount,vertices,x1,y2,z1);
		addPoint(vcount,vertices,x1,y1,z2);
		addPoint(vcount,vertices,x2,y1,z2);
		addPoint(vcount,vertices,x2,y2,z2);
		addPoint(vcount,vertices,x1,y2,z2);

		return true; // return cube


	}
	else
	{
		if ( scale )
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0]*=recip[0];
			center[1]*=recip[1];
			center[2]*=recip[2];

		}

	}



	vtx = (const char *) svertices;

	for (unsigned int i=0; i<svcount; i++)
	{

		const float *p = (const float *)vtx;
		vtx+=stride;

		float px = p[0];
		float py = p[1];
		float pz = p[2];

		if ( scale )
		{
			px = px*recip[0]; // normalize
			py = py*recip[1]; // normalize
			pz = pz*recip[2]; // normalize
		}

		if ( 1 )
		{
			unsigned int j;

			for (j=0; j<vcount; j++)
			{
				float *v = &vertices[j*3];

				float x = v[0];
				float y = v[1];
				float z = v[2];

				float dx = fabsf(x - px );
				float dy = fabsf(y - py );
				float dz = fabsf(z - pz );

				if ( dx < normalepsilon && dy < normalepsilon && dz < normalepsilon )
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					float dist1 = GetDist(px,py,pz,center);
					float dist2 = GetDist(v[0],v[1],v[2],center);

					if ( dist1 > dist2 )
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
					}

					break;
				}
			}

			if ( j == vcount )
			{
				float *dest = &vertices[vcount*3];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
	if ( 1 )
	{
		float bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
		float bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

		for (unsigned int i=0; i<vcount; i++)
		{
			const float *p = &vertices[i*3];
			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}

		float dx = bmax[0] - bmin[0];
		float dy = bmax[1] - bmin[1];
		float dz = bmax[2] - bmin[2];

		if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			float cx = dx*0.5f + bmin[0];
			float cy = dy*0.5f + bmin[1];
			float cz = dz*0.5f + bmin[2];

			float len = FLT_MAX;

			if ( dx >= EPSILON && dx < len ) len = dx;
			if ( dy >= EPSILON && dy < len ) len = dy;
			if ( dz >= EPSILON && dz < len ) len = dz;

			if ( len == FLT_MAX )
			{
				dx = dy = dz = 0.01f; // one centimeter
			}
			else
			{
				if ( dx < EPSILON ) dx = len * 0.05f; // 1/5th the shortest non-zero edge.
				if ( dy < EPSILON ) dy = len * 0.05f;
				if ( dz < EPSILON ) dz = len * 0.05f;
			}

			float x1 = cx - dx;
			float x2 = cx + dx;

			float y1 = cy - dy;
			float y2 = cy + dy;

			float z1 = cz - dz;
			float z2 = cz + dz;

			vcount = 0; // add box

			addPoint(vcount,vertices,x1,y1,z1);
			addPoint(vcount,vertices,x2,y1,z1);
			addPoint(vcount,vertices,x2,y2,z1);
			addPoint(vcount,vertices,x1,y2,z1);
			addPoint(vcount,vertices,x1,y1,z2);
			addPoint(vcount,vertices,x2,y1,z2);
			addPoint(vcount,vertices,x2,y2,z2);
			addPoint(vcount,vertices,x1,y2,z2);

			return true;
		}
	}

	return true;
}